

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaHash.c
# Opt level: O2

void Gia_ManHashStart(Gia_Man_t *p)

{
  int iLit0;
  int iLit1;
  int iVar1;
  Gia_Obj_t *pGVar2;
  int *piVar3;
  uint uVar4;
  long lVar5;
  
  Gia_ManHashAlloc(p);
  Gia_ManCleanValue(p);
  lVar5 = 0;
  while( true ) {
    if (p->nObjs <= lVar5) {
      return;
    }
    iVar1 = (int)lVar5;
    pGVar2 = Gia_ManObj(p,iVar1);
    if (pGVar2 == (Gia_Obj_t *)0x0) break;
    uVar4 = (uint)*(undefined8 *)pGVar2;
    if ((~uVar4 & 0x1fffffff) != 0 && -1 < (int)uVar4) {
      iLit0 = Abc_Var2Lit(iVar1 - (uVar4 & 0x1fffffff),uVar4 >> 0x1d & 1);
      uVar4 = (uint)((ulong)*(undefined8 *)pGVar2 >> 0x20);
      iLit1 = Abc_Var2Lit(iVar1 - (uVar4 & 0x1fffffff),uVar4 >> 0x1d & 1);
      uVar4 = 0xffffffff;
      if (p->pMuxes != (uint *)0x0) {
        uVar4 = p->pMuxes[lVar5];
        uVar4 = -(uint)(uVar4 == 0) | uVar4;
      }
      piVar3 = Gia_ManHashFind(p,iLit0,iLit1,uVar4);
      if (*piVar3 != 0) {
        __assert_fail("*pPlace == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaHash.c"
                      ,0x82,"void Gia_ManHashStart(Gia_Man_t *)");
      }
      iVar1 = Abc_Var2Lit(iVar1,0);
      *piVar3 = iVar1;
    }
    lVar5 = lVar5 + 1;
  }
  return;
}

Assistant:

void Gia_ManHashStart( Gia_Man_t * p )  
{
    Gia_Obj_t * pObj;
    int * pPlace, i;
    Gia_ManHashAlloc( p );
    Gia_ManCleanValue( p );
    Gia_ManForEachAnd( p, pObj, i )
    {
        pPlace = Gia_ManHashFind( p, Gia_ObjFaninLit0(pObj, i), Gia_ObjFaninLit1(pObj, i), Gia_ObjFaninLit2(p, i) );
        assert( *pPlace == 0 );
        *pPlace = Abc_Var2Lit( i, 0 );
    }
}